

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeIfElse(ExpressionContext *ctx,SynIfElse *syntax)

{
  IntrusiveList<ExprBase> expressions_00;
  bool bVar1;
  uint uVar2;
  SynVariableDefinitions *pSVar3;
  TypeBase *pTVar4;
  ExprVariableDefinition *pEVar5;
  ExprBase *pEVar6;
  ExprBoolLiteral *pEVar7;
  SynBlock *pSVar8;
  ExprBlock *pEVar9;
  SynBase *source;
  FunctionData *onwerFunction;
  ExprBase *closures;
  ExprIfElse *this;
  ExprBase *local_f8;
  ExprBase *falseBlock;
  undefined1 local_78 [8];
  IntrusiveList<ExprBase> expressions;
  ExprBase *trueBlock;
  SynBlock *node_1;
  SynBlock *node;
  ExprBoolLiteral *number;
  ExprVariableDefinition *variableDefinition;
  ExprBase *definition;
  TypeBase *type;
  ExprBase *condition;
  SynVariableDefinitions *definitions;
  SynIfElse *syntax_local;
  ExpressionContext *ctx_local;
  
  pSVar3 = getType<SynVariableDefinitions>(syntax->condition);
  if (pSVar3 == (SynVariableDefinitions *)0x0) {
    type = (TypeBase *)AnalyzeExpression(ctx,syntax->condition);
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    uVar2 = IntrusiveList<SynVariableDefinition>::size(&pSVar3->definitions);
    if (uVar2 != 1) {
      __assert_fail("definitions->definitions.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2b7f,"ExprBase *AnalyzeIfElse(ExpressionContext &, SynIfElse *)");
    }
    pTVar4 = AnalyzeType(ctx,pSVar3->type,true,(bool *)0x0);
    type = (TypeBase *)AnalyzeVariableDefinition(ctx,(pSVar3->definitions).head,0,pTVar4);
    pEVar5 = getType<ExprVariableDefinition>((ExprBase *)type);
    if (pEVar5 != (ExprVariableDefinition *)0x0) {
      pEVar6 = CreateVariableAccess(ctx,&syntax->super_SynBase,pEVar5->variable->variable,false);
      type = (TypeBase *)CreateSequence(ctx,&syntax->super_SynBase,(ExprBase *)type,pEVar6);
    }
  }
  if (((syntax->super_SynBase).field_0x3a & 1) != 0) {
    bVar1 = isType<TypeError>((TypeBase *)(type->name).end);
    if (bVar1) {
      pEVar6 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)pEVar6,&syntax->super_SynBase,ctx->typeVoid);
      return pEVar6;
    }
    type = (TypeBase *)CreateConditionCast(ctx,(SynBase *)(type->name).begin,(ExprBase *)type);
    pEVar6 = CreateCast(ctx,&syntax->super_SynBase,(ExprBase *)type,ctx->typeBool,false);
    pEVar6 = anon_unknown.dwarf_e7629::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar6);
    pEVar7 = getType<ExprBoolLiteral>(pEVar6);
    if (pEVar7 != (ExprBoolLiteral *)0x0) {
      if (((pEVar7->super_ExprBase).field_0x29 & 1) != 0) {
        pSVar8 = getType<SynBlock>(syntax->trueBlock);
        if (pSVar8 != (SynBlock *)0x0) {
          pEVar9 = AnalyzeBlock(ctx,pSVar8,false);
          return &pEVar9->super_ExprBase;
        }
        pEVar6 = AnalyzeStatement(ctx,syntax->trueBlock);
        return pEVar6;
      }
      if (syntax->falseBlock == (SynBase *)0x0) {
        pEVar6 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
        ExprVoid::ExprVoid((ExprVoid *)pEVar6,&syntax->super_SynBase,ctx->typeVoid);
        return pEVar6;
      }
      pSVar8 = getType<SynBlock>(syntax->falseBlock);
      if (pSVar8 != (SynBlock *)0x0) {
        pEVar9 = AnalyzeBlock(ctx,pSVar8,false);
        return &pEVar9->super_ExprBase;
      }
      pEVar6 = AnalyzeStatement(ctx,syntax->falseBlock);
      return pEVar6;
    }
    anon_unknown.dwarf_e7629::Report
              (ctx,&syntax->super_SynBase,"ERROR: couldn\'t evaluate condition at compilation time")
    ;
  }
  pEVar6 = CreateConditionCast(ctx,(SynBase *)(type->name).begin,(ExprBase *)type);
  expressions.tail = AnalyzeStatement(ctx,syntax->trueBlock);
  if (pSVar3 != (SynVariableDefinitions *)0x0) {
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)local_78);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_78,expressions.tail);
    pEVar9 = ExpressionContext::get<ExprBlock>(ctx);
    pTVar4 = ctx->typeVoid;
    source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    closures = CreateBlockUpvalueClose(ctx,source,onwerFunction,ctx->scope);
    expressions_00.tail = expressions.head;
    expressions_00.head = (ExprBase *)local_78;
    ExprBlock::ExprBlock(pEVar9,&syntax->super_SynBase,pTVar4,expressions_00,closures);
    expressions.tail = &pEVar9->super_ExprBase;
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT);
  }
  if (syntax->falseBlock == (SynBase *)0x0) {
    local_f8 = (ExprBase *)0x0;
  }
  else {
    local_f8 = AnalyzeStatement(ctx,syntax->falseBlock);
  }
  this = ExpressionContext::get<ExprIfElse>(ctx);
  ExprIfElse::ExprIfElse(this,&syntax->super_SynBase,ctx->typeVoid,pEVar6,expressions.tail,local_f8)
  ;
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeIfElse(ExpressionContext &ctx, SynIfElse *syntax)
{
	SynVariableDefinitions *definitions = getType<SynVariableDefinitions>(syntax->condition);

	ExprBase *condition = NULL;

	if(definitions)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		assert(definitions->definitions.size() == 1);

		TypeBase *type = AnalyzeType(ctx, definitions->type);

		ExprBase *definition = AnalyzeVariableDefinition(ctx, definitions->definitions.head, 0, type);

		if(ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition))
			condition = CreateSequence(ctx, syntax, definition, CreateVariableAccess(ctx, syntax, variableDefinition->variable->variable, false));
		else
			condition = definition;
	}
	else
	{
		condition = AnalyzeExpression(ctx, syntax->condition);
	}

	if(syntax->staticIf)
	{
		if(isType<TypeError>(condition->type))
			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

		condition = CreateConditionCast(ctx, condition->source, condition);

		if(ExprBoolLiteral *number = getType<ExprBoolLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, condition, ctx.typeBool, false))))
		{
			if(number->value)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->trueBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->trueBlock);
			}
			else if(syntax->falseBlock)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->falseBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->falseBlock);
			}

			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
		}

		Report(ctx, syntax, "ERROR: couldn't evaluate condition at compilation time");
	}

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);

	if(definitions)
	{
		IntrusiveList<ExprBase> expressions;

		expressions.push_back(trueBlock);

		trueBlock = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);
	}

	ExprBase *falseBlock = syntax->falseBlock ? AnalyzeStatement(ctx, syntax->falseBlock) : NULL;

	return new (ctx.get<ExprIfElse>()) ExprIfElse(syntax, ctx.typeVoid, condition, trueBlock, falseBlock);
}